

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hack.c
# Opt level: O1

boolean test_move(int ux,int uy,int dx,int dy,int dz,int mode)

{
  char cVar1;
  bool bVar2;
  level *plVar3;
  boolean bVar4;
  boolean bVar5;
  char cVar6;
  byte bVar7;
  schar sVar8;
  int iVar9;
  uint uVar10;
  d_level *pdVar11;
  trap *ptVar12;
  obj *poVar13;
  obj *poVar14;
  char *pcVar15;
  char *pcVar16;
  char cVar17;
  undefined4 in_register_0000000c;
  ulong uVar18;
  undefined4 in_register_00000014;
  byte bVar19;
  monst *worm;
  byte y;
  int iVar20;
  int iVar21;
  char *pcVar22;
  xchar x;
  int iVar23;
  long lVar24;
  bool bVar25;
  bool bVar26;
  xchar local_b0;
  xchar local_a0;
  d_level local_92;
  undefined8 local_90;
  undefined8 local_88;
  char *local_80;
  d_level *local_78;
  int local_70;
  int local_6c;
  long local_68;
  char *local_60;
  char *local_58;
  long local_50;
  d_level *local_48;
  d_level *local_40;
  long local_38;
  
  plVar3 = level;
  local_90 = CONCAT44(in_register_00000014,dx);
  local_88 = CONCAT44(in_register_0000000c,dy);
  iVar23 = dx + ux;
  iVar20 = dy + uy;
  pdVar11 = (d_level *)((long)iVar23 * 0xfc);
  lVar24 = (long)iVar20;
  local_80 = (char *)(lVar24 * 3);
  cVar6 = (&pdVar11[lVar24 * 6 + 2].dnum)[(long)&level->locations[0][0].field_0x0];
  cVar17 = (char)iVar20;
  x = (xchar)iVar23;
  local_78 = pdVar11;
  if (cVar6 < '\x11' || cVar6 == '\x16') {
    if ((u.uprops[0x1e].intrinsic != 0) ||
       (((ublindf != (obj *)0x0 && (ublindf->otyp != 0xed)) ||
        (((youmonst.data)->mflags1 & 0x1000) != 0)))) {
      if (ublindf == (obj *)0x0) {
        if (mode == 0) goto LAB_001a1e7f;
      }
      else if ((mode == 0) && (ublindf->oartifact != '\x1d')) {
LAB_001a1e7f:
        feel_location(x,cVar17);
      }
    }
    if (((u.uprops[0x3e].extrinsic == 0 && u.uprops[0x3e].intrinsic == 0) &&
        (((youmonst.data)->mflags1 & 8) == 0)) ||
       ((level->locations[x][cVar17].typ < '\x0f' &&
        ((level->locations[x][cVar17].field_0x7 & 1) != 0)))) {
      if ((&pdVar11[lVar24 * 6 + 2].dnum)[(long)&plVar3->locations[0][0].field_0x0] == '\x16') {
        if ((((mode == 0) && (flags.nopick == '\0')) && ((int)(youmonst.data)->mflags1 < 0)) &&
           (iVar9 = still_chewing(x,cVar17), iVar9 != 0)) {
          return '\0';
        }
        if (((u.uprops[0x3e].extrinsic == 0 && u.uprops[0x3e].intrinsic == 0) &&
            (((youmonst.data)->mflags1 & 8) == 0)) &&
           (bVar4 = passes_bars(youmonst.data), bVar4 == '\0')) {
          return '\0';
        }
      }
      else {
        if (((youmonst.data)->mflags1 & 0x60) != 0x20) {
          if ((((uwep != (obj *)0x0 && flags.autodig != '\0') &&
                (flags.nopick == '\0' && flags.run == 0)) && ((byte)(uwep->oclass | 4U) == 6)) &&
             (objects[uwep->otyp].oc_subtyp == '\x04')) {
            if (mode != 0) {
              return '\0';
            }
            use_pick_axe2(uwep,(schar)local_90,(schar)local_88,(schar)dz);
            return '\0';
          }
          if (mode != 0) {
            return '\0';
          }
          bVar4 = on_level(&u.uz,&dungeon_topology.d_stronghold_level);
          if ((bVar4 != '\0') && (bVar4 = is_db_wall(iVar23,iVar20), bVar4 != '\0')) {
            pline("The drawbridge is up!");
          }
          if ((u.uprops[0x3e].extrinsic == 0 && u.uprops[0x3e].intrinsic == 0) &&
             (((youmonst.data)->mflags1 & 8) == 0)) {
            return '\0';
          }
          if ('\x0e' < level->locations[x][cVar17].typ) {
            return '\0';
          }
          if ((level->locations[x][cVar17].field_0x7 & 1) == 0) {
            return '\0';
          }
          if (u.uz.dnum != dungeon_topology.d_sokoban_dnum) {
            return '\0';
          }
          pcVar22 = "The Sokoban walls resist your ability.";
          goto LAB_001a2470;
        }
        if (mode == 0) {
LAB_001a1f83:
          iVar9 = still_chewing(x,cVar17);
          if (iVar9 != 0) {
            return '\0';
          }
        }
      }
    }
  }
  else if (cVar6 == '\x17') {
    bVar4 = closed_door(level,iVar23,iVar20);
    if (bVar4 == '\0') {
LAB_001a22a8:
      if (((((int)local_90 != 0) && ((int)local_88 != 0)) && (u.uprops[0x3e].intrinsic == 0)) &&
         (((u.uprops[0x3e].extrinsic == 0 && (dz = 0x319ee0, ((youmonst.data)->mflags1 & 8) == 0))
          && (((*(ushort *)
                 (&pdVar11[lVar24 * 6 + 3].dnum + (long)&plVar3->locations[0][0].field_0x0) & 0x1e0)
               != 0 || ((bVar4 = on_level(&u.uz,&dungeon_topology.d_rogue_level), bVar4 != '\0' ||
                        (bVar4 = block_door(x,cVar17), bVar4 != '\0')))))))) {
        if ((u.uprops[0x1e].intrinsic == 0) &&
           (((ublindf == (obj *)0x0 || (ublindf->otyp == 0xed)) &&
            (((youmonst.data)->mflags1 & 0x1000) == 0)))) {
          return '\0';
        }
        if (ublindf == (obj *)0x0) {
          if (mode != 0) {
            return '\0';
          }
        }
        else {
          if (mode != 0) {
            return '\0';
          }
          if (ublindf->oartifact == '\x1d') {
            return '\0';
          }
        }
        feel_location(x,cVar17);
        return '\0';
      }
    }
    else {
      dz = 0x3196e8;
      if (((u.uprops[0x1e].intrinsic != 0) || ((ublindf != (obj *)0x0 && (ublindf->otyp != 0xed))))
         || (((youmonst.data)->mflags1 & 0x1000) != 0)) {
        if (ublindf == (obj *)0x0) {
          if (mode == 0) goto LAB_001a2068;
        }
        else if ((mode == 0) && (ublindf->oartifact != '\x1d')) {
LAB_001a2068:
          feel_location(x,cVar17);
        }
      }
      iVar9 = artifact_door(level,iVar23,iVar20);
      if (iVar9 != 0) {
        if (mode != 0) {
          return '\0';
        }
        uVar10 = (youmonst.data)->mflags1;
        if ((uVar10 & 4) != 0) {
          pcVar22 = "You try to ooze under the door, but the gap is too small.";
          goto LAB_001a2470;
        }
        if ((uVar10 & 0x60) == 0x20) {
          pcVar22 = "You hurt your teeth on the reinforced door.";
          goto LAB_001a2470;
        }
        if ((int)local_90 != 0 && (int)local_88 != 0) {
          return '\0';
        }
        if (u.uprops[0x1e].intrinsic == 0) {
          if (ublindf == (obj *)0x0) {
            if ((uVar10 >> 0xc & 1) != 0) goto LAB_001a2242;
          }
          else if (((uVar10 >> 0xc & 1) != 0) || (ublindf->otyp != 0xed)) goto LAB_001a2242;
LAB_001a3662:
          if (((u.uprops[0x1b].intrinsic == 0) &&
              (((u.umonnum != 0x9e && ((youmonst.data)->mlet != '\x1c')) &&
               (sVar8 = acurr(3), '\t' < sVar8)))) &&
             ((u.uprops[0x25].intrinsic == 0 && (u.uprops[0x25].extrinsic == 0))))
          goto LAB_001a37ad;
        }
        else {
LAB_001a2242:
          if ((ublindf != (obj *)0x0) && (ublindf->oartifact == '\x1d')) goto LAB_001a3662;
        }
        pcVar22 = "Ouch!  You bump into a heavy door.";
LAB_001a3688:
        pline(pcVar22);
        exercise(3,'\0');
        return '\0';
      }
      if ((u.uprops[0x3e].extrinsic == 0 && u.uprops[0x3e].intrinsic == 0) &&
         (((youmonst.data)->mflags1 & 8) == 0)) {
        bVar4 = can_ooze(&youmonst);
        if (bVar4 == '\0') {
          uVar10 = (youmonst.data)->mflags1;
          if ((uVar10 & 0x60) == 0x20) {
            if (mode != 0) goto LAB_001a2379;
            goto LAB_001a1f83;
          }
          if (mode != 0) {
            if ((mode & 0xfffffffeU) != 2) {
              return '\0';
            }
            goto LAB_001a22a8;
          }
          if ((uVar10 & 4) != 0) {
            pcVar22 = "You try to ooze under the door, but can\'t squeeze your possessions through."
            ;
            goto LAB_001a2470;
          }
          if ((int)local_90 != 0 && (int)local_88 != 0) {
            return '\0';
          }
          if (u.uprops[0x1e].intrinsic != 0) {
LAB_001a35ac:
            if ((ublindf != (obj *)0x0) && (ublindf->oartifact == '\x1d')) goto LAB_001a3c7c;
LAB_001a3c97:
            if (u.usteed == (monst *)0x0) {
              pcVar22 = "Ouch!  You bump into a door.";
              goto LAB_001a3688;
            }
            pcVar22 = y_monnam(u.usteed);
            pcVar15 = "You can\'t lead %s through that closed door.";
            goto LAB_001a340d;
          }
          if (ublindf == (obj *)0x0) {
            if ((uVar10 >> 0xc & 1) != 0) goto LAB_001a35ac;
          }
          else if (((uVar10 >> 0xc & 1) != 0) || (ublindf->otyp != 0xed)) goto LAB_001a35ac;
LAB_001a3c7c:
          if ((u.uprops[0x1b].intrinsic != 0) ||
             ((((u.umonnum == 0x9e || ((youmonst.data)->mlet == '\x1c')) ||
               (sVar8 = acurr(3), sVar8 < '\n')) ||
              ((u.uprops[0x25].intrinsic != 0 || (u.uprops[0x25].extrinsic != 0))))))
          goto LAB_001a3c97;
LAB_001a37ad:
          pcVar22 = "That door is closed.";
          goto LAB_001a2470;
        }
        if (mode == 0) {
          pline("You ooze under the door.");
        }
      }
    }
  }
LAB_001a2379:
  bVar25 = (int)local_90 != 0;
  bVar26 = (int)local_88 != 0;
  if (bVar26 && bVar25) {
    dz = 0x319ee0;
    local_a0 = (xchar)ux;
    bVar4 = bad_rock(youmonst.data,'\x01',local_a0,cVar17);
    if (bVar4 != '\0') {
      local_b0 = (xchar)uy;
      bVar4 = bad_rock(youmonst.data,'\x01',x,local_b0);
      if (bVar4 != '\0') {
        if (u.uz.dnum == dungeon_topology.d_sokoban_dnum) {
          if (mode != 0) {
            return '\0';
          }
          pcVar22 = "You cannot pass that way.";
LAB_001a2470:
          pline(pcVar22);
          return '\0';
        }
        if (2 < (youmonst.data)->msize) {
          if (mode != 0) {
            return '\0';
          }
          pcVar22 = "Your body is too large to fit through.";
          goto LAB_001a2470;
        }
        if (invent != (obj *)0x0) {
          dz = inv_weight();
          iVar9 = weight_cap();
          if (600 < iVar9 + dz) {
            if (mode != 0) {
              return '\0';
            }
            pcVar22 = "You are carrying too much to get through.";
            goto LAB_001a2470;
          }
        }
      }
    }
  }
  bVar4 = (boolean)dz;
  if ((flags.run == 8) && ((iVar23 != u.ux || (iVar20 != u.uy)))) {
    ptVar12 = t_at(level,iVar23,iVar20);
    if ((ptVar12 == (trap *)0x0) || ((ptVar12->field_0x8 & 0x20) == 0)) {
      bVar2 = true;
      if ((((u.uprops[0x12].extrinsic == 0 && u.uprops[0x12].intrinsic == 0) &&
           ((youmonst.data)->mlet != '\x05')) && (u.uprops[0x3c].extrinsic == 0)) &&
         (uVar10 = (youmonst.data)->mflags1, (uVar10 & 1) == 0)) {
        if (u.usteed == (monst *)0x0) {
          if ((uVar10 & 0x10) == 0) goto LAB_001a257d;
        }
        else if ((uVar10 & 0x10) == 0 && ((u.usteed)->data->mflags1 & 1) == 0) {
LAB_001a257d:
          bVar5 = is_pool(level,iVar23,iVar20);
          if ((((bVar5 != '\0') || (bVar5 = is_lava(level,iVar23,iVar20), bVar5 != '\0')) ||
              (bVar5 = is_swamp(level,iVar23,iVar20), bVar5 != '\0')) &&
             ((&local_78[(long)local_80 * 2 + 2].dlevel)[(long)&level->locations[0][0].field_0x0] !=
              '\0')) goto LAB_001a25d3;
        }
      }
    }
    else {
LAB_001a25d3:
      if (mode == 0) {
        bVar4 = is_pool(level,iVar23,iVar20);
        if (bVar4 == '\0') {
          bVar4 = is_lava(level,iVar23,iVar20);
          if (bVar4 != '\0') {
            pcVar22 = "a pool of lava";
            goto LAB_001a2645;
          }
          bVar4 = is_swamp(level,iVar23,iVar20);
          if (bVar4 != '\0') {
            pcVar22 = "a muddy swamp";
            goto LAB_001a2645;
          }
        }
        else {
          pcVar22 = "a body of water";
LAB_001a2645:
          autoexplore_msg(pcVar22);
        }
        bVar2 = false;
        bVar4 = '\0';
        if (flags.travel != '\0') goto LAB_001a266c;
      }
      bVar4 = mode == 3 || mode == 0;
      bVar2 = false;
    }
LAB_001a266c:
    if (!bVar2) {
      return bVar4;
    }
  }
  if (mode == 3) {
    return '\0';
  }
  if ((((bVar26 && bVar25) && u.uprops[0x3e].intrinsic == 0) && (u.uprops[0x3e].extrinsic == 0)) &&
     (((youmonst.data)->mflags1 & 8) == 0)) {
    if ((level->locations[ux][uy].typ == '\x17') &&
       ((((*(ushort *)&level->locations[ux][uy].field_0x6 & 0x1e0) != 0 ||
         (bVar5 = on_level(&u.uz,&dungeon_topology.d_rogue_level), bVar5 != '\0')) ||
        (bVar5 = block_entry(x,cVar17), bVar5 != '\0')))) {
      if (mode != 0) {
        return '\0';
      }
      pcVar22 = "the doorway";
      goto LAB_001a287e;
    }
  }
  poVar13 = sobj_at(0x214,level,iVar23,iVar20);
  if (poVar13 == (obj *)0x0) {
    return '\x01';
  }
  if (u.uz.dnum != dungeon_topology.d_sokoban_dnum) {
    if (u.uprops[0x3e].extrinsic != 0 || u.uprops[0x3e].intrinsic != 0) {
      return '\x01';
    }
    if (((youmonst.data)->mflags1 & 8) != 0) {
      return '\x01';
    }
  }
  if ((((u.uprops[0x1e].intrinsic == 0) && ((ublindf == (obj *)0x0 || (ublindf->otyp == 0xed)))) &&
      (((youmonst.data)->mflags1 & 0x1000) == 0)) ||
     ((ublindf != (obj *)0x0 && (ublindf->oartifact == '\x1d')))) {
    if ((u.uprops[0x23].intrinsic == 0) || (u.uprops[0x24].extrinsic != 0)) {
      if (mode != 2) goto LAB_001a284a;
    }
    else if (((u.umonnum != u.umonster) && (bVar5 = dmgtype(youmonst.data,0x24), mode != 2)) &&
            (bVar5 != '\0')) {
LAB_001a284a:
      if (1 < flags.run) {
        poVar13 = sobj_at(0x214,level,iVar23,iVar20);
        if (mode != 0) {
          return '\0';
        }
        if (poVar13 == (obj *)0x0) {
          return '\0';
        }
        pcVar22 = "a boulder";
LAB_001a287e:
        autoexplore_msg(pcVar22);
        return '\0';
      }
    }
  }
  if (mode != 2) {
    if (mode != 0) {
      return '\x01';
    }
    if ((((youmonst.data)->mflags1 & 0x60) == 0x20) &&
       (u.uz.dnum != dungeon_topology.d_sokoban_dnum)) {
      iVar20 = still_chewing(x,cVar17);
      if (iVar20 == 0) {
        return '\x01';
      }
      return '\0';
    }
    cVar6 = u.ux + (schar)local_90;
    cVar17 = u.uy + (schar)local_88;
    iVar20 = (int)cVar6;
    iVar23 = (int)cVar17;
    poVar13 = sobj_at(0x214,level,iVar20,iVar23);
    if (poVar13 == (obj *)0x0) {
      return '\x01';
    }
    local_50 = (long)iVar20;
    local_68 = (long)iVar23;
    local_6c = (int)local_90 * 2;
    local_70 = (int)local_88 * 2;
    local_38 = local_50 * 0xa8;
    local_78 = &u.uz;
    local_40 = &dungeon_topology.d_air_level;
    local_48 = &dungeon_topology.d_rogue_level;
    while( true ) {
      if (poVar13 != *(obj **)((long)level->objects[0] + local_68 * 8 + local_38)) {
        movobj(poVar13,cVar6,cVar17);
      }
      bVar19 = u.ux + (char)local_6c;
      y = u.uy + (char)local_70;
      if (-1 < multi) {
        u._1052_1_ = u._1052_1_ & 0xef;
        u.usleep = 0;
        multi = 0;
        memset(multi_txt,0,0x100);
        flags.run = 0;
        flags.mv = '\0';
        iflags.travel1 = '\0';
        flags.travel = '\0';
      }
      if (((u.uprops[0x12].extrinsic != 0 || u.uprops[0x12].intrinsic != 0) ||
          ((youmonst.data)->mlet == '\x05')) || (bVar4 = on_level(local_78,local_40), bVar4 != '\0')
         ) break;
      if (((youmonst.data)->msize == '\0') && (u.usteed == (monst *)0x0)) {
        if (((u.uprops[0x1e].intrinsic != 0) ||
            (((ublindf != (obj *)0x0 && (ublindf->otyp != 0xed)) ||
             (((youmonst.data)->mflags1 & 0x1000) != 0)))) &&
           ((ublindf == (obj *)0x0 || (ublindf->oartifact != '\x1d')))) {
          feel_location(cVar6,cVar17);
        }
        pcVar22 = xname(poVar13);
        pcVar15 = "You\'re too small to push that %s.";
LAB_001a3afc:
        pline(pcVar15,pcVar22);
        goto LAB_001a3b03;
      }
      if ((0x4e < (byte)(bVar19 - 1)) || (0x14 < y)) {
LAB_001a336f:
        if (u.usteed == (monst *)0x0) {
          pcVar22 = xname(poVar13);
          pcVar22 = the(pcVar22);
          pline("You try to move %s, but in vain.",pcVar22);
        }
        else {
          pcVar22 = y_monnam(u.usteed);
          pcVar22 = upstart(pcVar22);
          pcVar15 = xname(poVar13);
          pcVar15 = the(pcVar15);
          pline("%s tries to move %s, but cannot.",pcVar22,pcVar15);
        }
        if (((u.uprops[0x1e].intrinsic != 0) ||
            (((ublindf != (obj *)0x0 && (ublindf->otyp != 0xed)) ||
             (((youmonst.data)->mflags1 & 0x1000) != 0)))) &&
           ((ublindf == (obj *)0x0 || (ublindf->oartifact != '\x1d')))) {
          feel_location(cVar6,cVar17);
        }
LAB_001a3b03:
        if (((youmonst.data)->mflags2 & 0x8000000) != 0) {
          if ((u.usteed != (monst *)0x0) && (u.weapon_skills[0x27].skill < '\x02')) {
            pcVar22 = "push aside";
            if (u.uz.dnum != dungeon_topology.d_sokoban_dnum && flags.pickup != '\0') {
              pcVar22 = "pick up";
            }
            pcVar15 = xname(poVar13);
            pcVar15 = the(pcVar15);
            pcVar16 = y_monnam(u.usteed);
            pline("You aren\'t skilled enough to %s %s from %s.",pcVar22,pcVar15,pcVar16);
            return '\x01';
          }
          pcVar22 = "push it aside";
          if (u.uz.dnum != dungeon_topology.d_sokoban_dnum && flags.pickup != '\0') {
            pcVar22 = "pick it up";
          }
          pline("However, you can easily %s.",pcVar22);
          goto LAB_001a3c59;
        }
        if (u.usteed != (monst *)0x0) {
          return '\0';
        }
        if ((invent == (obj *)0x0) || (iVar20 = inv_weight(), iVar20 < -0x351)) {
          if (((schar)local_90 != '\0' && (schar)local_88 != '\0') &&
             (('\x10' < level->locations[u.ux][local_68].typ ||
              ('\x10' < level->locations[local_50][u.uy].typ)))) goto LAB_001a3b9b;
        }
        else {
LAB_001a3b9b:
          if ((youmonst.data)->msize != '\0') {
            return '\0';
          }
        }
        pline("However, you can squeeze yourself into a small opening.");
LAB_001a3c59:
        if (u.uz.dnum != dungeon_topology.d_sokoban_dnum) {
          return '\x01';
        }
        sokoban_trickster();
        return '\x01';
      }
      uVar18 = (ulong)y;
      local_80 = (char *)(uVar18 * 3);
      cVar1 = level->locations[bVar19][uVar18].typ;
      if (((cVar1 < '\x11') || (cVar1 == '\x16')) ||
         (((((schar)local_88 != '\0' && ((schar)local_90 != '\0')) && (cVar1 == '\x17')) &&
          ((bVar4 = on_level(local_78,local_48), bVar4 != '\0' ||
           ((*(ushort *)(&level->locations[bVar19][0].field_0x6 + (long)local_80 * 4) & 0x1e0) != 0)
           ))))) goto LAB_001a336f;
      iVar9 = (int)(char)bVar19;
      iVar21 = (int)(char)y;
      poVar14 = sobj_at(0x214,level,iVar9,iVar21);
      if (poVar14 != (obj *)0x0) goto LAB_001a336f;
      ptVar12 = t_at(level,iVar9,iVar21);
      worm = level->monsters[bVar19][uVar18];
      if (worm == (monst *)0x0) {
        worm = (monst *)0x0;
      }
      else if ((worm->field_0x61 & 2) != 0) {
        worm = (monst *)0x0;
      }
      if ((((schar)local_88 != '\0') && ((schar)local_90 != '\0')) &&
         (u.uz.dnum == dungeon_topology.d_sokoban_dnum)) {
        if (((u.uprops[0x1e].intrinsic != 0) ||
            (((ublindf != (obj *)0x0 && (ublindf->otyp != 0xed)) ||
             (((youmonst.data)->mflags1 & 0x1000) != 0)))) &&
           ((ublindf == (obj *)0x0 || (ublindf->oartifact != '\x1d')))) {
          feel_location(cVar6,cVar17);
        }
        pcVar22 = xname(poVar13);
        pcVar22 = The(pcVar22);
        pcVar15 = surface(iVar20,iVar23);
        pline("%s won\'t roll diagonally on this %s.",pcVar22,pcVar15);
        goto LAB_001a3b03;
      }
      bVar4 = revive_nasty(iVar9,iVar21,"You sense movement on the other side.");
      if (bVar4 != '\0') {
        return '\0';
      }
      if (((worm != (monst *)0x0) && (worm->data->mlet != '6')) &&
         (((worm->field_0x62 & 0x80) == 0 ||
          ((ptVar12 == (trap *)0x0 || (1 < (byte)((ptVar12->field_0x8 & 0x1f) - 0xb))))))) {
        if (((u.uprops[0x1e].intrinsic != 0) ||
            (((ublindf != (obj *)0x0 && (ublindf->otyp != 0xed)) ||
             (((youmonst.data)->mflags1 & 0x1000) != 0)))) &&
           ((ublindf == (obj *)0x0 || (ublindf->oartifact != '\x1d')))) {
          feel_location(cVar6,cVar17);
        }
        if (worm->wormno == '\0') {
          if (((viz_array[worm->my][worm->mx] & 2U) != 0) ||
             (((((u.uprops[0x1e].intrinsic == 0 &&
                 ((ublindf == (obj *)0x0 || (ublindf->otyp == 0xed)))) &&
                (((youmonst.data)->mflags1 & 0x1000) == 0)) ||
               ((ublindf != (obj *)0x0 && (ublindf->oartifact == '\x1d')))) &&
              (((u.uprops[0x40].extrinsic != 0 || u.uprops[0x40].intrinsic != 0 ||
                (((youmonst.data)->mflags3 & 0x100) != 0)) &&
               (((viz_array[worm->my][worm->mx] & 1U) != 0 && ((worm->data->mflags3 & 0x200) != 0)))
               ))))) goto LAB_001a3921;
LAB_001a396f:
          if (((((worm->data->mflags1 & 0x10000) == 0) &&
               ((poVar14 = which_armor(worm,4), poVar14 == (obj *)0x0 ||
                (poVar14 = which_armor(worm,4), poVar14->otyp != 0x4f)))) &&
              ((((u.uprops[0x1e].intrinsic != 0 ||
                 (((ublindf != (obj *)0x0 && (ublindf->otyp != 0xed)) ||
                  (((youmonst.data)->mflags1 & 0x1000) != 0)))) &&
                (((ublindf == (obj *)0x0 || (ublindf->oartifact != '\x1d')) &&
                 ((((youmonst.data == mons + 0x31 || youmonst.data == mons + 0x1e) ||
                   (u.uprops[0x19].extrinsic != 0 || u.uprops[0x19].intrinsic != 0)) ||
                   youmonst.data == mons + 0x32 && (u.uprops[0x19].blocked == 0)))))) ||
               (((u.uprops[0x19].extrinsic != 0 && (u.uprops[0x19].blocked == 0)) &&
                (iVar20 = dist2((int)worm->mx,(int)worm->my,(int)u.ux,(int)u.uy), iVar20 < 0x41)))))
              ) || (((u.uprops[0x42].intrinsic != 0 || (u.uprops[0x42].extrinsic != 0)) ||
                    (bVar4 = match_warn_of_mon(worm), bVar4 != '\0')))) goto LAB_001a3ab8;
          pcVar22 = xname(poVar13);
          pcVar22 = the(pcVar22);
          You_hear("a monster behind %s.",pcVar22);
          map_invisible(bVar19,y);
        }
        else {
          bVar4 = worm_known(level,worm);
          if (bVar4 == '\0') goto LAB_001a396f;
LAB_001a3921:
          uVar10 = *(uint *)&worm->field_0x60;
          if ((((uVar10 & 2) != 0) && (u.uprops[0xc].intrinsic == 0)) &&
             (u.uprops[0xc].extrinsic == 0)) {
            if (((uVar10 & 0x280) == 0) && (((youmonst.data)->mflags1 & 0x1000000) != 0))
            goto LAB_001a3961;
            goto LAB_001a396f;
          }
          if ((uVar10 & 0x280) != 0) goto LAB_001a396f;
LAB_001a3961:
          if ((u._1052_1_ & 0x20) != 0) goto LAB_001a396f;
LAB_001a3ab8:
          pcVar22 = a_monnam(worm);
          pline("There\'s %s on the other side.",pcVar22);
        }
        if (flags.verbose != '\0') {
          if (u.usteed == (monst *)0x0) {
            pcVar22 = "you";
          }
          else {
            pcVar22 = y_monnam(u.usteed);
          }
          pcVar15 = "Perhaps that\'s why %s cannot move it.";
          goto LAB_001a3afc;
        }
        goto LAB_001a3b03;
      }
      if (ptVar12 == (trap *)0x0) {
switchD_001a2bec_caseD_7:
        bVar4 = closed_door(level,iVar9,iVar21);
        if (bVar4 != '\0') goto LAB_001a336f;
        bVar4 = boulder_hits_pool(poVar13,iVar9,iVar21,'\x01');
        if (bVar4 == '\0') {
          if (poVar13 != level->objlist) {
            remove_object(poVar13);
            place_object(poVar13,level,(int)poVar13->ox,(int)poVar13->oy);
          }
          if (u.usteed == (monst *)0x0) {
            if ((long)(ulong)moves < (long)moverock_lastmovetime ||
                (long)(moverock_lastmovetime + 2) < (long)(ulong)moves) {
              pcVar22 = "little";
              if (((youmonst.data)->mflags2 >> 0x1b & 1) == 0) {
                pcVar22 = "great";
              }
              pcVar15 = xname(poVar13);
              pcVar15 = the(pcVar15);
              pline("With %s effort you move %s.",pcVar22,pcVar15);
            }
            exercise(0,'\x01');
          }
          else {
            pcVar22 = y_monnam(u.usteed);
            pcVar22 = upstart(pcVar22);
            pcVar15 = xname(poVar13);
            pcVar15 = the(pcVar15);
            pline("%s moves %s.",pcVar22,pcVar15);
          }
          moverock_lastmovetime = (ulong)moves;
          if (((&level->locations[bVar19][0].field_0x6)[(long)local_80 * 4] & 8) != 0) {
            unmap_object(iVar9,iVar21);
          }
          movobj(poVar13,bVar19,y);
          iVar9 = iVar20;
          iVar21 = iVar23;
          if (((u.uprops[0x1e].intrinsic == 0) &&
              (((ublindf == (obj *)0x0 || (ublindf->otyp == 0xed)) &&
               (((youmonst.data)->mflags1 & 0x1000) == 0)))) ||
             ((ublindf != (obj *)0x0 && (ublindf->oartifact == '\x1d')))) goto LAB_001a3238;
          feel_location(bVar19,y);
          feel_location(cVar6,cVar17);
        }
      }
      else {
        bVar7 = ptVar12->field_0x8 & 0x1f;
        switch(bVar7) {
        case 6:
          uVar10 = mt_random();
          if ((uVar10 * -0x33333333 >> 1 | (uint)((uVar10 * -0x33333333 & 1) != 0) << 0x1f) <
              0x1999999a) goto switchD_001a2bec_caseD_7;
          obj_extract_self(poVar13);
          place_object(poVar13,level,iVar9,iVar21);
          unblock_point(iVar20,iVar23);
          newsym(iVar20,iVar23);
          pcVar22 = Tobjnam(poVar13,"trigger");
          pcVar15 = "your";
          if (-1 < (char)ptVar12->field_0x8) {
            pcVar15 = "a";
          }
          pline("KAABLAMM!!!  %s %s land mine.",pcVar22,pcVar15);
          blow_up_landmine(ptVar12);
          fill_pit(level,(int)u.ux,(int)u.uy);
          bVar19 = viz_array[uVar18][bVar19];
          break;
        default:
          goto switchD_001a2bec_caseD_7;
        case 0xb:
        case 0xc:
          obj_extract_self(poVar13);
          if (((u.uprops[0x1e].intrinsic == 0) &&
              (((ublindf == (obj *)0x0 || (ublindf->otyp == 0xed)) &&
               (((youmonst.data)->mflags1 & 0x1000) == 0)))) ||
             ((ublindf != (obj *)0x0 && (ublindf->oartifact == '\x1d')))) {
            viz_array[uVar18][bVar19] = viz_array[uVar18][bVar19] | 2;
          }
          bVar4 = flooreffects(poVar13,iVar9,iVar21,"fall");
          if (bVar4 == '\0') {
            place_object(poVar13,level,iVar9,iVar21);
          }
          if ((worm == (monst *)0x0) ||
             ((((u.uprops[0x1e].intrinsic != 0 ||
                ((ublindf != (obj *)0x0 && (ublindf->otyp != 0xed)))) ||
               (((youmonst.data)->mflags1 & 0x1000) != 0)) &&
              ((ublindf == (obj *)0x0 || (ublindf->oartifact != '\x1d')))))) goto LAB_001a323d;
          goto LAB_001a3238;
        case 0xd:
        case 0xe:
          if ((((u.uprops[0x1e].intrinsic == 0) &&
               ((ublindf == (obj *)0x0 || (ublindf->otyp == 0xed)))) &&
              (((youmonst.data)->mflags1 & 0x1000) == 0)) ||
             ((ublindf != (obj *)0x0 && (ublindf->oartifact == '\x1d')))) {
            pcVar22 = "fall";
            if (bVar7 == 0xe) {
              pcVar22 = "trigger";
            }
            local_80 = Tobjnam(poVar13,pcVar22);
            local_58 = " into";
            if ((ptVar12->field_0x8 & 0x1f) == 0xe) {
              local_58 = "";
            }
            local_60 = otense(poVar13,"plug");
            pcVar22 = "plugs a hole";
            if ((ptVar12->field_0x8 & 0x1f) == 0xe) {
              pcVar22 = "plugs a trap door";
            }
            pcVar15 = surface(iVar9,iVar21);
            pline("%s%s and %s a %s in the %s!",local_80,local_58,local_60,pcVar22 + 8,pcVar15);
          }
          else {
            pcVar22 = xname(poVar13);
            pcVar22 = the(pcVar22);
            pline("Kerplunk!  You no longer feel %s.",pcVar22);
          }
          deltrap(level,ptVar12);
          delobj(poVar13);
          bury_objs(iVar9,iVar21);
          bVar19 = viz_array[uVar18][bVar19];
          break;
        case 0x10:
        case 0x11:
          if (u.usteed == (monst *)0x0) {
            pcVar22 = xname(poVar13);
            pcVar22 = the(pcVar22);
            pline("You push %s and suddenly it disappears!",pcVar22);
          }
          else {
            pcVar22 = y_monnam(u.usteed);
            pcVar22 = upstart(pcVar22);
            pcVar15 = xname(poVar13);
            pcVar15 = the(pcVar15);
            pline("%s pushes %s and suddenly it disappears!",pcVar22,pcVar15);
          }
          if ((ptVar12->field_0x8 & 0x1f) == 0x10) {
            rloco(poVar13);
          }
          else {
            iVar9 = random_teleport_level();
            sVar8 = depth(local_78);
            if ((iVar9 == sVar8) || (u.uz.dnum == dungeon_topology.d_astral_level.dnum))
            goto LAB_001a323d;
            obj_extract_self(poVar13);
            get_level(&local_92,iVar9);
            deliver_object(poVar13,local_92.dnum,local_92.dlevel,0);
          }
          seetrap(ptVar12);
          goto LAB_001a323d;
        }
        if ((bVar19 & 2) != 0) {
LAB_001a3238:
          newsym(iVar9,iVar21);
        }
      }
LAB_001a323d:
      poVar13 = sobj_at(0x214,level,iVar20,iVar23);
      if (poVar13 == (obj *)0x0) {
        return '\x01';
      }
    }
    if (((u.uprops[0x1e].intrinsic != 0) ||
        (((ublindf != (obj *)0x0 && (ublindf->otyp != 0xed)) ||
         (((youmonst.data)->mflags1 & 0x1000) != 0)))) &&
       ((ublindf == (obj *)0x0 || (ublindf->oartifact != '\x1d')))) {
      feel_location(cVar6,cVar17);
    }
    pcVar22 = xname(poVar13);
    pcVar22 = the(pcVar22);
    pcVar15 = "You don\'t have enough leverage to push %s.";
LAB_001a340d:
    pline(pcVar15,pcVar22);
    return '\0';
  }
  bVar25 = false;
  bVar5 = '\0';
  if (u.uz.dnum == dungeon_topology.d_sokoban_dnum) goto LAB_001a333d;
  poVar13 = sobj_at(0x214,level,ux,uy);
  if (((poVar13 != (obj *)0x0) && (u.uz.dnum != dungeon_topology.d_sokoban_dnum)) &&
     ((u.uprops[0x3e].extrinsic == 0 && u.uprops[0x3e].intrinsic == 0 &&
      (((((youmonst.data)->mflags1 & 0x60) != 0x20 &&
         (char)(((youmonst.data)->mflags1 & 8) >> 3) == '\0' &&
        (poVar13 = carrying(0x108), poVar13 == (obj *)0x0)) &&
       (poVar13 = carrying(0x33), poVar13 == (obj *)0x0)))))) {
    poVar13 = carrying(0x1cf);
    if (poVar13 == (obj *)0x0) {
      bVar25 = false;
      bVar5 = '\0';
      goto LAB_001a333d;
    }
    bVar25 = false;
    bVar5 = '\0';
    if ((objects[poVar13->otyp].field_0x10 & 1) != 0) goto LAB_001a333d;
  }
  bVar25 = true;
  bVar5 = bVar4;
LAB_001a333d:
  if (bVar25) {
    return '\x01';
  }
  return bVar5;
}

Assistant:

boolean test_move(int ux, int uy, int dx, int dy, int dz, int mode)
{
    int x = ux+dx;
    int y = uy+dy;
    struct rm *tmpr = &level->locations[x][y];
    struct rm *ust;

    /*
     *  Check for physical obstacles.  First, the place we are going.
     */
    if (IS_ROCK(tmpr->typ) || tmpr->typ == IRONBARS) {
	if (Blind && mode == DO_MOVE) feel_location(x,y);
	if (Passes_walls && may_passwall(level, x,y)) {
	    ;	/* do nothing */
	} else if (tmpr->typ == IRONBARS) {
	    /* Eat the bars if you can. */
	    if ((mode == DO_MOVE && !flags.nopick &&
		 metallivorous(youmonst.data) && still_chewing(x, y)) ||
		!(Passes_walls || passes_bars(youmonst.data)))
		return FALSE;
	} else if (tunnels(youmonst.data) && !needspick(youmonst.data)) {
	    /* Eat the rock. */
	    if (mode == DO_MOVE && still_chewing(x,y)) return FALSE;
	} else if (flags.autodig && !flags.run && !flags.nopick &&
		   uwep && is_pick(uwep)) {
	    /* MRKR: Automatic digging when wielding the appropriate tool */
	    if (mode == DO_MOVE)
		use_pick_axe2(uwep, dx, dy, dz);
	    return FALSE;
	} else {
	    if (mode == DO_MOVE) {
		if (Is_stronghold(&u.uz) && is_db_wall(x,y))
		    pline("The drawbridge is up!");
		if (Passes_walls && !may_passwall(level, x,y) && In_sokoban(&u.uz))
		    pline("The Sokoban walls resist your ability.");
	    }
	    return FALSE;
	}
    } else if (IS_DOOR(tmpr->typ)) {
	if (closed_door(level, x,y)) {
	    if (Blind && mode == DO_MOVE) feel_location(x,y);
	    /* ALI - artifact doors */
	    if (artifact_door(level, x, y)) {
		if (mode == DO_MOVE) {
		    if (amorphous(youmonst.data)) {
			pline("You try to ooze under the door, "
			      "but the gap is too small.");
		    } else if (tunnels(youmonst.data) && !needspick(youmonst.data)) {
			pline("You hurt your teeth on the reinforced door.");
		    } else if (x == ux || y == uy) {
			if (Blind || Stunned || ACURR(A_DEX) < 10 || Fumbling) {
			    pline("Ouch!  You bump into a heavy door.");
			    exercise(A_DEX, FALSE);
			} else {
			    pline("That door is closed.");
			}
		    }
		}
		return FALSE;
	    } else if (Passes_walls)
		;	/* do nothing */
	    else if (can_ooze(&youmonst)) {
		if (mode == DO_MOVE) pline("You ooze under the door.");
	    } else if (tunnels(youmonst.data) && !needspick(youmonst.data)) {
		/* Eat the door. */
		if (mode == DO_MOVE && still_chewing(x,y)) return FALSE;
	    } else {
		if (mode == DO_MOVE) {
		    if (amorphous(youmonst.data))
			pline("You try to ooze under the door, but can't squeeze your possessions through.");
		    else if (x == ux || y == uy) {
			if (Blind || Stunned || ACURR(A_DEX) < 10 || Fumbling) {
			    if (u.usteed) {
				pline("You can't lead %s through that closed door.",
				         y_monnam(u.usteed));
			    } else {
			        pline("Ouch!  You bump into a door.");
			        exercise(A_DEX, FALSE);
			    }
			} else pline("That door is closed.");
		    }
		} else if (mode == TEST_TRAV || mode == TEST_TRAP) goto testdiag;
		return FALSE;
	    }
	} else {
	testdiag:
	    if (dx && dy && !Passes_walls
		&& ((tmpr->doormask & ~D_BROKEN)
		    || Is_rogue_level(&u.uz)
		    || block_door(x,y))) {
		/* Diagonal moves into a door are not allowed. */
		if (Blind && mode == DO_MOVE)
		    feel_location(x,y);
		return FALSE;
	    }
	}
    }
    if (dx && dy
	    && bad_rock(youmonst.data, TRUE, ux,y)
	    && bad_rock(youmonst.data, TRUE, x,uy)) {
	/* Move at a diagonal. */
	if (In_sokoban(&u.uz)) {
	    if (mode == DO_MOVE)
		pline("You cannot pass that way.");
	    return FALSE;
	}
	if (bigmonst(youmonst.data)) {
	    if (mode == DO_MOVE)
		pline("Your body is too large to fit through.");
	    return FALSE;
	}
	if (invent && (inv_weight() + weight_cap() > 600)) {
	    if (mode == DO_MOVE)
		pline("You are carrying too much to get through.");
	    return FALSE;
	}
    }
    /* Pick travel path that does not require crossing a trap.
     * Avoid water and lava using the usual running rules.
     * (but not u.ux/u.uy because findtravelpath walks toward u.ux/u.uy) */
    if (flags.run == 8 && (x != u.ux || y != u.uy)) {
	struct trap* t = t_at(level, x, y);

	if ((t && t->tseen) ||
	    (!Levitation && !Flying &&
	     !is_clinger(youmonst.data) &&
	     (is_pool(level, x, y) || is_lava(level, x, y) || is_swamp(level, x, y)) &&
	     level->locations[x][y].seenv)) {
	    if (mode == DO_MOVE) {
		if (is_pool(level, x, y)) autoexplore_msg("a body of water");
		else if (is_lava(level, x, y)) autoexplore_msg("a pool of lava");
		else if (is_swamp(level, x, y)) autoexplore_msg("a muddy swamp");
		if (flags.travel) return FALSE;
	    }
	    return mode == TEST_TRAP || mode == DO_MOVE;
	}
    }

    if (mode == TEST_TRAP) return FALSE; /* not a move through a trap */

    ust = &level->locations[ux][uy];

    /* Now see if other things block our way . . */
    if (dx && dy && !Passes_walls
		     && (IS_DOOR(ust->typ) && ((ust->doormask & ~D_BROKEN)
			     || Is_rogue_level(&u.uz)
			     || block_entry(x, y))
			 )) {
	/* Can't move at a diagonal out of a doorway with door. */
	if (mode == DO_MOVE)
	    autoexplore_msg("the doorway");
	return FALSE;
    }

    if (sobj_at(BOULDER, level, x, y) && (In_sokoban(&u.uz) || !Passes_walls)) {
	if (!(Blind || Hallucination) && (flags.run >= 2) && mode != TEST_TRAV) {
	    if (sobj_at(BOULDER, level, x, y) && mode == DO_MOVE)
		autoexplore_msg("a boulder");
	    return FALSE;
	}
	if (mode == DO_MOVE) {
	    /* tunneling monsters will chew before pushing */
	    if (tunnels(youmonst.data) && !needspick(youmonst.data) &&
		!In_sokoban(&u.uz)) {
		if (still_chewing(x,y)) return FALSE;
	    } else
		if (moverock(dx, dy) < 0) return FALSE;
	} else if (mode == TEST_TRAV) {
	    struct obj* obj;

	    /* never travel through boulders in Sokoban */
	    if (In_sokoban(&u.uz)) return FALSE;

	    /* don't pick two boulders in a row, unless there's a way thru */
	    if (sobj_at(BOULDER, level, ux,uy) && !In_sokoban(&u.uz)) {
		if (!Passes_walls &&
		    !(tunnels(youmonst.data) && !needspick(youmonst.data)) &&
		    !carrying(PICK_AXE) && !carrying(DWARVISH_MATTOCK) &&
		    !((obj = carrying(WAN_DIGGING)) &&
		      !objects[obj->otyp].oc_name_known))
		    return FALSE;
	    }
	}
	/* assume you'll be able to push it when you get there... */
    }

    /* OK, it is a legal place to move. */
    return TRUE;
}